

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void __thiscall sf::priv::RenderTextureImplFBO::~RenderTextureImplFBO(RenderTextureImplFBO *this)

{
  bool bVar1;
  pointer this_00;
  undefined8 *in_RDI;
  pair<unsigned_long_long,_unsigned_int> pVar2;
  pair<std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>,_bool> pVar3;
  iterator iter_1;
  iterator iter;
  GLuint depthStencilBuffer;
  GLuint colorBuffer;
  Lock lock;
  TransientContextLock contextLock;
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *in_stack_fffffffffffffed8;
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  *in_stack_fffffffffffffee0;
  TransientContextLock *this_01;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  TransientContextLock *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  value_type *__x;
  set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
  *in_stack_ffffffffffffff00;
  _Self local_80;
  undefined1 local_78 [16];
  undefined1 local_68;
  unsigned_long_long local_60;
  uint local_58;
  unsigned_long_long local_50;
  uint local_48;
  _Self local_40;
  _Self local_38;
  GLuint local_30;
  GLuint local_2c;
  undefined8 *local_28;
  undefined8 *local_20;
  
  *in_RDI = &PTR__RenderTextureImplFBO_002f8780;
  GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffef0);
  Lock::Lock((Lock *)in_stack_fffffffffffffef0,
             (Mutex *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  local_20 = in_RDI + 1;
  std::
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::erase(in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
  local_28 = in_RDI + 7;
  std::
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::erase(in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
  if (*(int *)((long)in_RDI + 0x6c) != 0) {
    local_2c = *(GLuint *)((long)in_RDI + 0x6c);
    (*sf_glad_glDeleteRenderbuffersEXT)(1,&local_2c);
  }
  if (*(int *)(in_RDI + 0xd) != 0) {
    local_30 = *(GLuint *)(in_RDI + 0xd);
    (*sf_glad_glDeleteRenderbuffersEXT)(1,&local_30);
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
       ::begin(in_stack_fffffffffffffed8);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(in_stack_fffffffffffffed8);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)0x222bd3);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)0x222be2);
    pVar2 = std::make_pair<unsigned_long_long_const&,unsigned_int&>
                      ((unsigned_long_long *)in_stack_fffffffffffffee0,
                       (uint *)in_stack_fffffffffffffed8);
    local_60 = pVar2.first;
    local_58 = pVar2.second;
    local_50 = local_60;
    local_48 = local_58;
    pVar3 = std::
            set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
            ::insert(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_78._8_8_ = pVar3.first._M_node;
    local_68 = pVar3.second;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
               in_stack_fffffffffffffee0);
  }
  local_78._0_8_ =
       std::
       map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
       ::begin(in_stack_fffffffffffffed8);
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(in_stack_fffffffffffffed8);
    bVar1 = std::operator!=((_Self *)local_78,&local_80);
    if (!bVar1) break;
    __x = (value_type *)local_78;
    this_00 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                         0x222cd9);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)0x222ce8);
    std::make_pair<unsigned_long_long_const&,unsigned_int&>
              ((unsigned_long_long *)in_stack_fffffffffffffee0,(uint *)in_stack_fffffffffffffed8);
    std::
    set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
    ::insert((set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
              *)this_00,__x);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
               in_stack_fffffffffffffee0);
  }
  anon_unknown.dwarf_1d67ba::destroyStaleFBOs();
  this_01 = (TransientContextLock *)in_RDI[0xf];
  if (this_01 != (TransientContextLock *)0x0) {
    Context::~Context((Context *)this_01);
    operator_delete(this_01);
  }
  Lock::~Lock((Lock *)this_01);
  GlResource::TransientContextLock::~TransientContextLock(this_01);
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~map((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
          *)0x222dd7);
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~map((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
          *)0x222de5);
  GlResource::~GlResource((GlResource *)0x222def);
  RenderTextureImpl::~RenderTextureImpl((RenderTextureImpl *)0x222df9);
  return;
}

Assistant:

RenderTextureImplFBO::~RenderTextureImplFBO()
{
    TransientContextLock contextLock;

    Lock lock(mutex);

    // Remove the frame buffer mapping from the set of all active mappings
    frameBuffers.erase(&m_frameBuffers);
    frameBuffers.erase(&m_multisampleFrameBuffers);

    // Destroy the color buffer
    if (m_colorBuffer)
    {
        GLuint colorBuffer = m_colorBuffer;
        glCheck(GLEXT_glDeleteRenderbuffers(1, &colorBuffer));
    }

    // Destroy the depth/stencil buffer
    if (m_depthStencilBuffer)
    {
        GLuint depthStencilBuffer = m_depthStencilBuffer;
        glCheck(GLEXT_glDeleteRenderbuffers(1, &depthStencilBuffer));
    }

    // Move all frame buffer objects to stale set
    for (std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.begin(); iter != m_frameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    for (std::map<Uint64, unsigned int>::iterator iter = m_multisampleFrameBuffers.begin(); iter != m_multisampleFrameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    // Clean up FBOs
    destroyStaleFBOs();

    // Delete the backup context if we had to create one
    delete m_context;
}